

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_ARC(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t dam_00;
  source origin;
  wchar_t local_44;
  wchar_t local_38;
  wchar_t flg;
  wchar_t degrees_of_arc;
  wchar_t diameter_of_source;
  loc_conflict target;
  wchar_t rad;
  wchar_t type;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  dam_00 = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  target.y = context->subtype;
  target.x = context->radius;
  _degrees_of_arc = (loc_conflict)loc(-1,-1);
  flg = L'\x04';
  if (context->other < L'\x14') {
    local_44 = L'\x14';
  }
  else {
    local_44 = context->other;
  }
  local_38 = L'Ѱ';
  if (target.x == L'\0') {
    target.x = (wchar_t)z_info->max_range;
  }
  if ((context->origin).what == SRC_MONSTER) {
    local_38 = L'౰';
    degrees_of_arc = (player->grid).x;
    unique0x00012004 = (player->grid).y;
  }
  else if ((context->origin).what == SRC_PLAYER) {
    if ((context->dir == L'\x05') && (_Var1 = target_okay(), _Var1)) {
      target_get((loc *)&degrees_of_arc);
    }
    else {
      _degrees_of_arc = (loc_conflict)loc_sum(player->grid,ddgrid[context->dir]);
    }
  }
  if (local_44 < L'<') {
    flg = 0xf0 / local_44;
  }
  if (L'\x19' < flg) {
    flg = L'\x19';
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var1 = project(origin,target.x,_degrees_of_arc,dam_00,target.y,local_38,local_44,(uint8_t)flg,
                  context->obj);
  if (_Var1) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_ARC(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int type = context->subtype;
	int rad = context->radius;

	struct loc target = loc(-1, -1);

	/* Diameter of source starts at 4, so full strength up to 3 grids from
	 * the caster. */
	int diameter_of_source = 4;

	/* Short beams now have their own effect, so we set a minimum arc width */
	int degrees_of_arc = MAX(context->other, 20);

	int flg = PROJECT_ARC | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Radius of zero means no fixed limit. */
	if (rad == 0) {
		rad = z_info->max_range;
	}

	/* Player or monster? */
	if (context->origin.what == SRC_MONSTER) {
		flg |= PROJECT_PLAY;
		target =  player->grid;
	} else if (context->origin.what == SRC_PLAYER) {
		/* Ask for a target if no direction given */
		if (context->dir == DIR_TARGET && target_okay()) {
			target_get(&target);
		} else {
			target = loc_sum(player->grid, ddgrid[context->dir]);
		}
	}

	/* Diameter of the energy source. */
	if (degrees_of_arc < 60) {
		diameter_of_source = diameter_of_source * 60 / degrees_of_arc;
	}

	/* Max */
	if (diameter_of_source > 25) {
		diameter_of_source = 25;
	}

	/* Aim at the target */
	if (project(context->origin, rad, target, dam, type, flg, degrees_of_arc,
				diameter_of_source, context->obj)) {
		context->ident = true;
	}

	return true;
}